

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_line<charls::transform_hp2<unsigned_char>,unsigned_char>
               (quad<unsigned_char> *destination,quad<unsigned_char> *source,size_t pixel_count,
               transform_hp2<unsigned_char> *transform,uint32_t mask)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  
  if (pixel_count != 0) {
    sVar1 = 0;
    do {
      uVar2 = source[sVar1].super_triplet<unsigned_char>.field_0.v1 & mask;
      uVar3 = source[sVar1].super_triplet<unsigned_char>.field_1.v2 & mask;
      destination[sVar1] =
           (quad<unsigned_char>)
           ((((uint)source[sVar1].field_0.v4 & mask & 0xff) << 0x18 |
            uVar2 - uVar3 & 0xff |
            uVar3 << 8 |
            ((source[sVar1].super_triplet<unsigned_char>.field_2.v3 & mask) - (uVar3 + uVar2 >> 1) &
            0xff) << 0x10) ^ 0x800080);
      sVar1 = sVar1 + 1;
    } while (pixel_count != sVar1);
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform, const uint32_t mask) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] =
            quad<PixelType>(transform(source[i].v1 & mask, source[i].v2 & mask, source[i].v3 & mask), source[i].v4 & mask);
    }
}